

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O0

void sago::PlatformFoldersAddFromFile
               (string *filename,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *folders)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  istream *piVar5;
  long lVar6;
  mapped_type *this;
  char cVar7;
  exception *e;
  string value;
  size_t valueEnd;
  size_t valueStart;
  string key;
  size_t splitPos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_240 [8];
  string line;
  ifstream infile;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *folders_local;
  string *filename_local;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar4,_S_in);
  std::__cxx11::string::string(local_240);
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(line.field_2._M_local_buf + 8),local_240);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar2) break;
    lVar6 = std::__cxx11::string::length();
    bVar1 = false;
    bVar2 = true;
    if (lVar6 != 0) {
      pcVar4 = (char *)std::__cxx11::string::at((ulong)local_240);
      bVar2 = true;
      if (*pcVar4 != '#') {
        std::__cxx11::string::substr((ulong)&local_270,(ulong)local_240);
        bVar1 = true;
        bVar3 = std::operator!=(&local_270,"XDG_");
        bVar2 = true;
        if (!bVar3) {
          lVar6 = std::__cxx11::string::find((char *)local_240,0x112186);
          bVar2 = lVar6 == -1;
        }
      }
    }
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_270);
    }
    if (!bVar2) {
      key.field_2._8_8_ = std::__cxx11::string::find((char)local_240,0x3d);
      std::__cxx11::string::substr((ulong)&valueStart,(ulong)local_240);
      cVar7 = (char)local_240;
      std::__cxx11::string::find(cVar7,0x22);
      value.field_2._8_8_ = std::__cxx11::string::find(cVar7,0x22);
      std::__cxx11::string::substr((ulong)&e,(ulong)local_240);
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](folders,(key_type *)&valueStart);
      std::__cxx11::string::operator=((string *)this,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&valueStart);
    }
  }
  std::__cxx11::string::~string(local_240);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  return;
}

Assistant:

static void PlatformFoldersAddFromFile(const std::string& filename, std::map<std::string, std::string>& folders) {
	std::ifstream infile(filename.c_str());
	std::string line;
	while (std::getline(infile, line)) {
		if (line.length() == 0 || line.at(0) == '#' || line.substr(0, 4) != "XDG_" || line.find("_DIR") == std::string::npos) {
			continue;
		}
		try {
			std::size_t splitPos = line.find('=');
			std::string key = line.substr(0, splitPos);
			std::size_t valueStart = line.find('"', splitPos);
			std::size_t valueEnd = line.find('"', valueStart+1);
			std::string value = line.substr(valueStart+1, valueEnd - valueStart - 1);
			folders[key] = value;
		}
		catch (std::exception&  e) {
			std::cerr << "WARNING: Failed to process \"" << line << "\" from \"" << filename << "\". Error: "<< e.what() << "\n";
			continue;
		}
	}
}